

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O0

bool __thiscall
Rml::DecoratorText::GenerateGeometry(DecoratorText *this,Element *element,ElementData *element_data)

{
  StableVectorIndex SVar1;
  undefined8 uVar2;
  pointer pTVar3;
  bool bVar4;
  int iVar5;
  FontFaceHandle FVar6;
  FontEngineInterface *pFVar7;
  long lVar8;
  Context *this_00;
  size_type __n;
  pointer pGVar9;
  reference pvVar10;
  reference pvVar11;
  float x;
  float y;
  Vector2<float> VVar12;
  ElementData local_1c8;
  undefined1 local_1a0 [24];
  size_t i;
  undefined1 local_180 [8];
  Vector<TexturedGeometry> textured_geometry;
  StringView local_148;
  undefined1 local_138 [8];
  TexturedMeshList mesh_list;
  RenderManager *render_manager;
  Colour<unsigned_char,_255,_true> local_110;
  float local_10c;
  ColourbPremultiplied text_color;
  float opacity;
  Vector2f offset;
  Vector2<float> local_e8;
  Vector2f offset_within_align_area;
  Vector2f local_d8;
  Vector2<float> local_d0;
  Vector2f size_of_align_area;
  Vector2f local_c0;
  Vector2<float> local_b8;
  Vector2f offset_to_align_area;
  Vector2f text_size;
  RenderBox render_box;
  FontMetrics *metrics;
  char *local_68;
  int local_5c;
  String *pSStack_58;
  int string_width;
  TextShapingContext text_shaping_context;
  ComputedValues *computed;
  int new_version;
  FontEngineInterface *font_engine_interface;
  FontFaceHandle font_face_handle;
  ElementData *element_data_local;
  Element *element_local;
  DecoratorText *this_local;
  undefined4 extraout_var;
  
  FVar6 = Element::GetFontFaceHandle(element);
  if (FVar6 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pFVar7 = GetFontEngineInterface();
    iVar5 = (*pFVar7->_vptr_FontEngineInterface[0xb])(pFVar7,FVar6);
    if (iVar5 == element_data->font_handle_version) {
      this_local._7_1_ = true;
    }
    else {
      text_shaping_context._8_8_ = Element::GetComputedValues(element);
      pSStack_58 = Style::ComputedValues::language_abi_cxx11_
                             ((ComputedValues *)text_shaping_context._8_8_);
      text_shaping_context.language._0_1_ =
           Style::ComputedValues::direction((ComputedValues *)text_shaping_context._8_8_);
      text_shaping_context.language._4_4_ =
           Style::ComputedValues::letter_spacing((ComputedValues *)text_shaping_context._8_8_);
      StringView::StringView((StringView *)&metrics,&this->text);
      local_5c = (*pFVar7->_vptr_FontEngineInterface[9])
                           (pFVar7,FVar6,metrics,local_68,&stack0xffffffffffffffa8);
      iVar5 = (*pFVar7->_vptr_FontEngineInterface[8])(pFVar7,FVar6);
      lVar8 = CONCAT44(extraout_var,iVar5);
      Element::GetRenderBox((RenderBox *)&text_size,element,element_data->paint_area,0);
      Vector2<float>::Vector2
                (&offset_to_align_area,(float)local_5c,*(float *)(lVar8 + 4) + *(float *)(lVar8 + 8)
                );
      local_c0 = RenderBox::GetFillOffset((RenderBox *)&text_size);
      Vector2<float>::Vector2(&size_of_align_area,0.0,*(float *)(lVar8 + 4));
      local_b8 = Vector2<float>::operator+(&local_c0,size_of_align_area);
      local_d8 = RenderBox::GetFillSize((RenderBox *)&text_size);
      offset_within_align_area = offset_to_align_area;
      local_d0 = Vector2<float>::operator-(&local_d8,offset_to_align_area);
      x = Element::ResolveNumericValue(element,(this->align).x,local_d0.x);
      y = Element::ResolveNumericValue(element,(this->align).y,local_d0.y);
      Vector2<float>::Vector2(&local_e8,x,y);
      _text_color = local_e8;
      VVar12 = Vector2<float>::operator+(&local_b8,local_e8);
      local_10c = Style::ComputedValues::opacity((ComputedValues *)text_shaping_context._8_8_);
      if ((this->inherit_color & 1U) == 0) {
        render_manager._4_4_ = this->color;
      }
      else {
        render_manager._4_4_ =
             Style::ComputedValues::color((ComputedValues *)text_shaping_context._8_8_);
      }
      local_110 = Colour<unsigned_char,255,false>::
                  ToPremultiplied<std::integral_constant<bool,false>,void>
                            ((Colour<unsigned_char,255,false> *)((long)&render_manager + 4),
                             local_10c);
      this_00 = Element::GetContext(element);
      mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)Context::GetRenderManager(this_00);
      ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::vector
                ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_138);
      pTVar3 = mesh_list.super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage;
      StringView::StringView(&local_148,&this->text);
      textured_geometry.
      super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = local_110;
      (*pFVar7->_vptr_FontEngineInterface[10])
                (VVar12,local_10c,pFVar7,pTVar3,FVar6,0,local_148.p_begin,local_148.p_end,local_110,
                 &stack0xffffffffffffffa8,local_138);
      bVar4 = ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::empty
                        ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_138)
      ;
      if (bVar4) {
        this_local._7_1_ = false;
        textured_geometry.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
      }
      else {
        __n = ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::size
                        ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_138)
        ;
        ::std::allocator<Rml::DecoratorText::TexturedGeometry>::allocator
                  ((allocator<Rml::DecoratorText::TexturedGeometry> *)((long)&i + 7));
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::vector((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                  *)local_180,__n,(allocator<Rml::DecoratorText::TexturedGeometry> *)((long)&i + 7))
        ;
        ::std::allocator<Rml::DecoratorText::TexturedGeometry>::~allocator
                  ((allocator<Rml::DecoratorText::TexturedGeometry> *)((long)&i + 7));
        local_1a0._16_8_ = (pointer)0x0;
        while( true ) {
          uVar2 = local_1a0._16_8_;
          pGVar9 = (pointer)::std::
                            vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                            ::size((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                                    *)local_180);
          pTVar3 = mesh_list.
                   super__Vector_base<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>._M_impl
                   .super__Vector_impl_data._M_end_of_storage;
          if (pGVar9 <= (ulong)uVar2) break;
          ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::operator[]
                    ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_138,
                     local_1a0._16_8_);
          RenderManager::MakeGeometry((RenderManager *)local_1a0,&pTVar3->mesh);
          pvVar10 = ::std::
                    vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                    ::operator[]((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                                  *)local_180,local_1a0._16_8_);
          Geometry::operator=(&pvVar10->geometry,(Geometry *)local_1a0);
          Geometry::~Geometry((Geometry *)local_1a0);
          pvVar11 = ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::operator[]
                              ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)
                               local_138,local_1a0._16_8_);
          pvVar10 = ::std::
                    vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                    ::operator[]((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                                  *)local_180,local_1a0._16_8_);
          (pvVar10->texture).render_manager = (pvVar11->texture).render_manager;
          SVar1 = (pvVar11->texture).callback_index;
          (pvVar10->texture).file_index = (pvVar11->texture).file_index;
          (pvVar10->texture).callback_index = SVar1;
          local_1a0._16_8_ =
               (long)&(((Mesh *)local_1a0._16_8_)->vertices).
                      super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                      super__Vector_impl_data._M_start + 1;
        }
        local_1c8.paint_area = element_data->paint_area;
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::vector(&local_1c8.textured_geometry,
                 (vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                  *)local_180);
        local_1c8.font_handle_version = (*pFVar7->_vptr_FontEngineInterface[0xb])(pFVar7,FVar6);
        ElementData::operator=(element_data,&local_1c8);
        ElementData::~ElementData(&local_1c8);
        this_local._7_1_ = true;
        textured_geometry.
        super__Vector_base<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
        ::std::
        vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
        ::~vector((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                   *)local_180);
      }
      ::std::vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_>::~vector
                ((vector<Rml::TexturedMesh,_std::allocator<Rml::TexturedMesh>_> *)local_138);
    }
  }
  return this_local._7_1_;
}

Assistant:

bool DecoratorText::GenerateGeometry(Element* element, ElementData& element_data) const
{
	FontFaceHandle font_face_handle = element->GetFontFaceHandle();
	if (font_face_handle == 0)
		return false;

	FontEngineInterface* font_engine_interface = GetFontEngineInterface();
	const int new_version = font_engine_interface->GetVersion(font_face_handle);
	if (new_version == element_data.font_handle_version)
		return true;

	const auto& computed = element->GetComputedValues();
	const TextShapingContext text_shaping_context{computed.language(), computed.direction(), computed.letter_spacing()};

	const int string_width = font_engine_interface->GetStringWidth(font_face_handle, text, text_shaping_context);

	const FontMetrics& metrics = font_engine_interface->GetFontMetrics(font_face_handle);
	const RenderBox render_box = element->GetRenderBox(element_data.paint_area);
	const Vector2f text_size = {float(string_width), metrics.ascent + metrics.descent};
	const Vector2f offset_to_align_area = render_box.GetFillOffset() + Vector2f{0, metrics.ascent};
	const Vector2f size_of_align_area = render_box.GetFillSize() - text_size;
	const Vector2f offset_within_align_area =
		Vector2f{element->ResolveNumericValue(align.x, size_of_align_area.x), element->ResolveNumericValue(align.y, size_of_align_area.y)};

	const Vector2f offset = offset_to_align_area + offset_within_align_area;
	const float opacity = computed.opacity();
	const ColourbPremultiplied text_color = (inherit_color ? computed.color() : color).ToPremultiplied(opacity);

	RenderManager& render_manager = element->GetContext()->GetRenderManager();
	TexturedMeshList mesh_list;
	font_engine_interface->GenerateString(render_manager, font_face_handle, {}, text, offset, text_color, opacity, text_shaping_context, mesh_list);

	if (mesh_list.empty())
		return false;

	Vector<TexturedGeometry> textured_geometry(mesh_list.size());
	for (size_t i = 0; i < textured_geometry.size(); i++)
	{
		textured_geometry[i].geometry = render_manager.MakeGeometry(std::move(mesh_list[i].mesh));
		textured_geometry[i].texture = mesh_list[i].texture;
	}

	element_data = ElementData{
		element_data.paint_area,
		std::move(textured_geometry),
		font_engine_interface->GetVersion(font_face_handle),
	};

	return true;
}